

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_align_bits(DisasContext_conflict6 *ctx,int wordsz,int rd,int rs,int rt,int bits)

{
  TCGContext_conflict6 *s;
  TCGTemp *pTVar1;
  TCGTemp *a1;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  TCGOpcode TVar4;
  uintptr_t o_4;
  TCGv_i64 ret;
  uintptr_t o_3;
  
  if (rd == 0) {
    return;
  }
  s = ctx->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar1 - (long)s);
  if (bits != 0 && bits != wordsz) {
    a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    if (rt == 0) {
      TVar4 = INDEX_op_movi_i64;
      pTVar2 = (TCGv_i64)0x0;
LAB_009a3904:
      tcg_gen_op2_mips64el(s,TVar4,(TCGArg)pTVar1,(TCGArg)pTVar2);
    }
    else if (s->cpu_gpr[rt] != ret) {
      pTVar2 = s->cpu_gpr[rt] + (long)s;
      TVar4 = INDEX_op_mov_i64;
      goto LAB_009a3904;
    }
    pTVar2 = (TCGv_i64)((long)a1 - (long)s);
    if (rs == 0) {
      TVar4 = INDEX_op_movi_i64;
      pTVar3 = (TCGv_i64)0x0;
LAB_009a398c:
      tcg_gen_op2_mips64el(s,TVar4,(TCGArg)a1,(TCGArg)pTVar3);
    }
    else if (s->cpu_gpr[rs] != pTVar2) {
      pTVar3 = s->cpu_gpr[rs] + (long)s;
      TVar4 = INDEX_op_mov_i64;
      goto LAB_009a398c;
    }
    if (wordsz == 0x40) {
      tcg_gen_shli_i64_mips64el(s,ret,ret,(long)bits);
      tcg_gen_shri_i64_mips64el(s,pTVar2,pTVar2,(long)(0x40 - bits));
      tcg_gen_op3_mips64el
                (s,INDEX_op_or_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)rd]),
                 (TCGArg)a1,(TCGArg)pTVar1);
    }
    else if (wordsz == 0x20) {
      pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      pTVar3 = (TCGv_i64)((long)pTVar1 - (long)s);
      tcg_gen_deposit_i64_mips64el(s,pTVar3,pTVar2,ret,0x20,0x20);
      tcg_gen_shri_i64_mips64el(s,pTVar3,pTVar3,(long)(0x20 - bits));
      tcg_gen_ext32s_i64_mips64el(s,s->cpu_gpr[(uint)rd],pTVar3);
      tcg_temp_free_internal_mips64el(s,pTVar1);
    }
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar2 + (long)s));
    goto LAB_009a3aa4;
  }
  if (bits == 0) {
    if (rt != 0) goto LAB_009a38d8;
LAB_009a393a:
    TVar4 = INDEX_op_movi_i64;
    pTVar2 = (TCGv_i64)0x0;
LAB_009a3948:
    tcg_gen_op2_mips64el(s,TVar4,(TCGArg)pTVar1,(TCGArg)pTVar2);
  }
  else {
    rt = rs;
    if (rs == 0) goto LAB_009a393a;
LAB_009a38d8:
    if (s->cpu_gpr[rt] != ret) {
      pTVar2 = s->cpu_gpr[rt] + (long)s;
      TVar4 = INDEX_op_mov_i64;
      goto LAB_009a3948;
    }
  }
  if (wordsz == 0x40) {
    if (s->cpu_gpr[(uint)rd] != ret) {
      tcg_gen_op2_mips64el
                (s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[(uint)rd] + (long)s),(TCGArg)pTVar1);
    }
  }
  else if (wordsz == 0x20) {
    tcg_gen_ext32s_i64_mips64el(s,s->cpu_gpr[(uint)rd],ret);
  }
LAB_009a3aa4:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(ret + (long)s));
  return;
}

Assistant:

static void gen_align_bits(DisasContext *ctx, int wordsz, int rd, int rs,
                           int rt, int bits)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }
    t0 = tcg_temp_new(tcg_ctx);
    if (bits == 0 || bits == wordsz) {
        if (bits == 0) {
            gen_load_gpr(tcg_ctx, t0, rt);
        } else {
            gen_load_gpr(tcg_ctx, t0, rs);
        }
        switch (wordsz) {
        case 32:
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
            break;
#if defined(TARGET_MIPS64)
        case 64:
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
            break;
#endif
        }
    } else {
        TCGv t1 = tcg_temp_new(tcg_ctx);
        gen_load_gpr(tcg_ctx, t0, rt);
        gen_load_gpr(tcg_ctx, t1, rs);
        switch (wordsz) {
        case 32:
            {
                TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
                tcg_gen_concat_tl_i64(tcg_ctx, t2, t1, t0);
                tcg_gen_shri_i64(tcg_ctx, t2, t2, 32 - bits);
                gen_move_low32(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
                tcg_temp_free_i64(tcg_ctx, t2);
            }
            break;
#if defined(TARGET_MIPS64)
        case 64:
            tcg_gen_shli_tl(tcg_ctx, t0, t0, bits);
            tcg_gen_shri_tl(tcg_ctx, t1, t1, 64 - bits);
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t1, t0);
            break;
#endif
        }
        tcg_temp_free(tcg_ctx, t1);
    }

    tcg_temp_free(tcg_ctx, t0);
}